

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

float glu::TextureTestUtil::computeNonProjectedTriLod
                (LodMode mode,IVec2 *dstSize,IVec2 *srcSize,Vec3 *sq,Vec3 *tq)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float dy;
  float dx;
  float dvy;
  float dvx;
  float duy;
  float dux;
  Vec3 *tq_local;
  Vec3 *sq_local;
  IVec2 *srcSize_local;
  IVec2 *dstSize_local;
  LodMode mode_local;
  
  fVar7 = tcu::Vector<float,_3>::z(sq);
  fVar8 = tcu::Vector<float,_3>::x(sq);
  iVar1 = tcu::Vector<int,_2>::x(srcSize);
  fVar9 = tcu::Vector<float,_3>::y(sq);
  fVar10 = tcu::Vector<float,_3>::x(sq);
  iVar2 = tcu::Vector<int,_2>::x(srcSize);
  fVar11 = tcu::Vector<float,_3>::z(tq);
  fVar12 = tcu::Vector<float,_3>::x(tq);
  iVar3 = tcu::Vector<int,_2>::y(srcSize);
  fVar13 = tcu::Vector<float,_3>::y(tq);
  fVar14 = tcu::Vector<float,_3>::x(tq);
  iVar4 = tcu::Vector<int,_2>::y(srcSize);
  iVar5 = tcu::Vector<int,_2>::x(dstSize);
  iVar6 = tcu::Vector<int,_2>::y(dstSize);
  fVar7 = computeLodFromDerivates
                    (mode,((fVar7 - fVar8) * (float)iVar1) / (float)iVar5,
                     ((fVar11 - fVar12) * (float)iVar3) / (float)iVar5,
                     ((fVar9 - fVar10) * (float)iVar2) / (float)iVar6,
                     ((fVar13 - fVar14) * (float)iVar4) / (float)iVar6);
  return fVar7;
}

Assistant:

static float computeNonProjectedTriLod (LodMode mode, const tcu::IVec2& dstSize, const tcu::IVec2& srcSize, const tcu::Vec3& sq, const tcu::Vec3& tq)
{
	float dux	= (sq.z() - sq.x()) * (float)srcSize.x();
	float duy	= (sq.y() - sq.x()) * (float)srcSize.x();
	float dvx	= (tq.z() - tq.x()) * (float)srcSize.y();
	float dvy	= (tq.y() - tq.x()) * (float)srcSize.y();
	float dx	= (float)dstSize.x();
	float dy	= (float)dstSize.y();

	return computeLodFromDerivates(mode, dux/dx, dvx/dx, duy/dy, dvy/dy);
}